

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

int __thiscall VPLGrammar::Parser::ShiftExpressionNode::GetType(ShiftExpressionNode *this)

{
  ShiftExpressionNode *this_local;
  
  return 0x26;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                children_[0]->BuildProgram(scope, out);
                for (size_t i = 2; i < children_.size(); i += 2) {
                    children_[i]->BuildProgram(scope, out);
                    out << "    ";
                    switch(children_[i - 1]->GetType()) {
                        case kShiftLeftType:
                            out << "    shl\n";
                            break;
                        case kShiftRightType:
                            out << "    shr\n";
                            break;
                    }
                    out << '\n';
                    scope->Pop();
                }
            }